

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

uint32_t bitset_container_rank_many
                   (bitset_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint32_t *puVar7;
  
  uVar1 = *begin;
  iVar6 = 0;
  uVar4 = 0;
  for (puVar7 = begin;
      (puVar3 = end, puVar7 != end && (uVar2 = *puVar7, puVar3 = puVar7, (uVar2 ^ uVar1) < 0x10000))
      ; puVar7 = puVar7 + 1) {
    for (uVar4 = (ulong)(int)uVar4; (long)uVar4 < (long)(ulong)(uVar2 >> 6 & 0x3ff);
        uVar4 = uVar4 + 1) {
      uVar5 = container->words[uVar4];
      uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      iVar6 = iVar6 + (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38);
    }
    uVar5 = (2L << ((byte)uVar2 & 0x3f)) - 1U & container->words[uVar4 & 0xffffffff];
    uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
    uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
    *ans = (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
           (long)iVar6 + start_rank;
    ans = ans + 1;
  }
  return (uint32_t)((ulong)((long)puVar3 - (long)begin) >> 2);
}

Assistant:

uint32_t bitset_container_rank_many(const bitset_container_t *container, uint64_t start_rank, const uint32_t* begin, const uint32_t* end, uint64_t* ans){
  const uint16_t high = (uint16_t)((*begin) >> 16);
  int i = 0;
  int sum = 0;
  const uint32_t* iter = begin;
  for(; iter != end; iter++) {
      uint32_t x = *iter;
      uint16_t xhigh = (uint16_t)(x >> 16);
      if(xhigh != high) return iter - begin; // stop at next container

      uint16_t xlow = (uint16_t)x;
      for(int count = xlow / 64; i < count; i++){
        sum += roaring_hamming(container->words[i]);
      }
      uint64_t lastword = container->words[i];
      uint64_t lastpos = UINT64_C(1) << (xlow % 64);
      uint64_t mask = lastpos + lastpos - 1; // smear right
      *(ans++) = start_rank + sum + roaring_hamming(lastword & mask);
  }
  return iter - begin;
}